

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grafika2.cpp
# Opt level: O0

void line(int x0,int y0,int x1,int y1)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  undefined4 extraout_EDX;
  undefined4 in_register_00000014;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  uchar *sig;
  size_t in_R8;
  undefined4 local_48;
  undefined4 local_44;
  int x_1;
  int y_1;
  int D_1;
  int y;
  int x;
  int D;
  int dy;
  int ady;
  int deltay;
  int dx;
  int adx;
  int deltax;
  int y1_local;
  int x1_local;
  int y0_local;
  int x0_local;
  
  sig = (uchar *)CONCAT44(in_register_00000034,y0);
  uVar1 = x1 - x0;
  uVar2 = uVar1;
  if ((int)uVar1 < 1) {
    uVar2 = -uVar1;
  }
  iVar3 = sign((EVP_PKEY_CTX *)(ulong)uVar1,sig,(size_t *)CONCAT44(in_register_00000014,x1),
               (uchar *)(ulong)-uVar1,in_R8);
  uVar4 = y1 - y0;
  uVar1 = uVar4;
  if ((int)uVar4 < 1) {
    uVar1 = -uVar4;
  }
  iVar5 = sign((EVP_PKEY_CTX *)(ulong)uVar4,sig,(size_t *)CONCAT44(extraout_var,extraout_EDX),
               (uchar *)(ulong)-uVar4,in_R8);
  setWarna(x0,y0);
  if ((int)uVar2 < (int)uVar1) {
    y = uVar2 * 2 - uVar1;
    D_1 = x0;
    if (0 < y) {
      D_1 = iVar3 + x0;
      y = y + uVar1 * -2;
    }
    for (y_1 = y0 + iVar5; y_1 != y1; y_1 = iVar5 + y_1) {
      setWarna(D_1,y_1);
      for (y = uVar2 * 2 + y; 0 < y; y = y + uVar1 * -2) {
        D_1 = iVar3 + D_1;
      }
    }
  }
  else {
    x_1 = uVar1 * 2 - uVar2;
    local_44 = y0;
    if (0 < x_1) {
      local_44 = iVar5 + y0;
      x_1 = x_1 + uVar2 * -2;
    }
    for (local_48 = x0 + iVar3; local_48 != x1; local_48 = iVar3 + local_48) {
      setWarna(local_48,local_44);
      for (x_1 = uVar1 * 2 + x_1; 0 < x_1; x_1 = x_1 + uVar2 * -2) {
        local_44 = iVar5 + local_44;
      }
    }
  }
  return;
}

Assistant:

void line(int x0, int y0, int x1, int y1)
{
  int deltax = x1 - x0;
  int adx = abs(deltax);
  int dx = sign(deltax);

  int deltay = y1 - y0;
  int ady = abs(deltay);
  int dy = sign(deltay);

  setWarna(x0, y0);
  if (adx < ady) {
    int D = 2 * adx - ady;
    int x = x0;
    if (D > 0) {
      x += dx;
      D -= 2 * ady;
    }

    for (int y = y0 + dy; y != y1; y += dy) {
      setWarna(x, y);
      D += 2 * adx;
      while (D > 0) {
        x += dx;
        D -= 2 * ady;
      }
    }
  }
  else {
    int D = 2 * ady - adx;    
    int y = y0;
    if (D > 0) {
      y += dy;
      D -= 2 * adx;
    }

    for (int x = x0 + dx; x != x1; x += dx) {
      setWarna(x, y);
      D += 2 * ady;
      while (D > 0) {
        y += dy;
        D -= 2 * adx;
      }
    }
  }
}